

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add_from_memory
                    (nk_font_atlas *atlas,void *memory,nk_size size,float height,
                    nk_font_config *config)

{
  nk_font *pnVar1;
  long lVar2;
  nk_font_config *pnVar3;
  nk_font_config local_58;
  
  if (memory == (void *)0x0) {
    __assert_fail("memory",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2fc9,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2fca,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2fcc,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2fcd,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2fce,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2fcf,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2fd0,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (config == (nk_font_config *)0x0) {
    local_58.padding[2] = '\0';
    local_58.padding[0] = '\0';
    local_58.padding[1] = '\0';
    local_58.next = (nk_font_config *)0x0;
    local_58.merge_mode = '\0';
    local_58.pixel_snap = '\0';
    local_58.oversample_v = '\x01';
    local_58.oversample_h = '\x03';
    local_58.coord_type = NK_COORD_UV;
    local_58.spacing.x = 0.0;
    local_58.spacing.y = 0.0;
    local_58.range = nk_font_default_glyph_ranges::ranges;
    local_58.font = (nk_baked_font *)0x0;
    local_58.fallback_glyph = 0x3f;
    local_58._68_8_ = 0;
    local_58._76_8_ = 0;
    local_58.p._4_4_ = 0;
  }
  else {
    pnVar3 = &local_58;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      pnVar3->next = config->next;
      config = (nk_font_config *)&config->ttf_blob;
      pnVar3 = (nk_font_config *)((long)pnVar3 + 8);
    }
  }
  local_58.ttf_data_owned_by_atlas = '\0';
  local_58.ttf_blob = memory;
  local_58.ttf_size = size;
  local_58.size = height;
  pnVar1 = nk_font_atlas_add(atlas,&local_58);
  return pnVar1;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_memory(struct nk_font_atlas *atlas, void *memory,
    nk_size size, float height, const struct nk_font_config *config)
{
    struct nk_font_config cfg;
    NK_ASSERT(memory);
    NK_ASSERT(size);

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->temporary.alloc || !atlas->temporary.free || !memory || !size ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = memory;
    cfg.ttf_size = size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 0;
    return nk_font_atlas_add(atlas, &cfg);
}